

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O3

void __thiscall Farm::editBasket(Farm *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  long lVar3;
  double dVar4;
  __node_type *p_Var5;
  Farm *pFVar6;
  iterator iVar7;
  iterator iVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  Basket b;
  int nif;
  int i;
  double weight;
  string local_b8;
  int local_98;
  int local_94;
  __node_type *local_90;
  Farm *local_88;
  double local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Enter client\'s nif: ","");
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_manager;
  getOption(&local_98,&local_b8,(function<bool_(int)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p._0_4_ = local_98;
  iVar7 = std::
          _Hashtable<int,_std::pair<const_int,_Client>,_std::allocator<std::pair<const_int,_Client>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->clients)._M_h,(key_type *)&local_b8);
  if (iVar7.super__Node_iterator_base<std::pair<const_int,_Client>,_false>._M_cur ==
      (__node_type *)0x0) {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "ERROR: Doesn\'t exists a client with the given nif, please create a new one!","");
    cinERR(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ENTER to go back","");
    enterWait(&local_b8);
  }
  else {
    iVar8 = std::
            _Hashtable<int,_std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->baskets)._M_h,&local_98);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Client doesn\'t have any active baskets to delivery!","");
      cinERR(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ENTER to go back","");
      enterWait(&local_b8);
    }
    else {
      local_88 = this;
      line(0x14,'-');
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Client\'s baskets:",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      line(0x14,'-');
      local_94 = 0;
      puVar2 = *(undefined8 **)
                ((long)iVar8.
                       super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                       ._M_cur + 0x18);
      local_90 = (__node_type *)iVar8;
      for (puVar10 = *(undefined8 **)
                      ((long)iVar8.
                             super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                             ._M_cur + 0x10); puVar10 != puVar2; puVar10 = puVar10 + 2) {
        local_b8._M_dataplus._M_p = (pointer)*puVar10;
        local_b8._M_string_length = puVar10[1];
        local_94 = local_94 + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID: ",4);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_94);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," | Weight: ",0xb);
        dVar4 = Basket::getWeight((Basket *)&local_b8);
        poVar9 = std::ostream::_M_insert<double>(dVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      paVar1 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Enter ID of the basket to be edited: ","");
      local_50._8_8_ = 0;
      local_50._M_unused._M_object = &local_94;
      local_38 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:224:61)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:224:61)>
                 ::_M_manager;
      getOption(&local_98,&local_b8,(function<bool_(int)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      pFVar6 = local_88;
      p_Var5 = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Enter basket\'s new weight: ","");
      getDouble(&local_80,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      lVar3 = *(long *)((long)&(p_Var5->
                               super__Hash_node_value<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>
                               ._M_storage._M_storage + 8);
      if ((ulong)(*(long *)((long)&(p_Var5->
                                   super__Hash_node_value<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>
                                   ._M_storage._M_storage + 0x10) - lVar3 >> 4) <=
          (ulong)(long)local_98) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      Basket::setWeight((Basket *)(lVar3 + (long)local_98 * 0x10),local_80);
      pFVar6->clientsFileChanged = true;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Basket successfully edited!",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ENTER to go back","");
      enterWait(&local_b8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Farm::editBasket() {
    int nif;

    getOption(nif, "Enter client's nif: ");
    if(!searchClientByNIF(nif)){
        cinERR("ERROR: Doesn't exists a client with the given nif, please create a new one!");
        enterWait();
        return;
    }

    const auto& cb_pair = baskets.find(nif);
    if(cb_pair == baskets.end()){
        cinERR("Client doesn't have any active baskets to delivery!");
        enterWait();
        return;
    }

    line(20);
    cout << "Client's baskets:" << endl;
    line(20);

    int i=0;
    for(Basket b: cb_pair->second){
        i++;
        cout << "ID: " << i << " | Weight: " << b.getWeight() << endl;
    }

    getOption(nif, "Enter ID of the basket to be edited: ", [&](int a){ return a > 0 && a < i; });

    double weight;
    getDouble(weight, "Enter basket's new weight: ");
    cb_pair->second.at(nif).setWeight(weight);

    clientsFileChanged = true;
    cout << "Basket successfully edited!" << endl;
    enterWait();
}